

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

RTPTransmissionInfo * __thiscall
jrtplib::RTPUDPv4Transmitter::GetTransmissionInfo(RTPUDPv4Transmitter *this)

{
  RTPMemoryManager *mgr;
  RTPUDPv4Transmitter *this_00;
  list<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  RTPTransmissionInfo *tinf;
  RTPUDPv4Transmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local = (RTPUDPv4Transmitter *)0x0;
  }
  else {
    tinf = (RTPTransmissionInfo *)this;
    mgr = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
    this_00 = (RTPUDPv4Transmitter *)operator_new(0x38,mgr,0x1c);
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::list(&local_38,&this->localIPs)
    ;
    RTPUDPv4TransmissionInfo::RTPUDPv4TransmissionInfo
              ((RTPUDPv4TransmissionInfo *)this_00,&local_38,this->rtpsock,this->rtcpsock,
               this->m_rtpPort,this->m_rtcpPort);
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::~list(&local_38);
    this_local = this_00;
  }
  return (RTPTransmissionInfo *)this_local;
}

Assistant:

RTPTransmissionInfo *RTPUDPv4Transmitter::GetTransmissionInfo()
{
	if (!init)
		return 0;

	MAINMUTEX_LOCK
	RTPTransmissionInfo *tinf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMISSIONINFO) RTPUDPv4TransmissionInfo(localIPs,rtpsock,rtcpsock,m_rtpPort,m_rtcpPort);
	MAINMUTEX_UNLOCK
	return tinf;
}